

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O1

nng_err nni_http_server_del_handler(nni_http_server *s,nni_http_handler *h)

{
  nni_http_handler *item;
  nng_err nVar1;
  nni_list *list;
  
  nni_mtx_lock(&s->mtx);
  list = &s->handlers;
  item = (nni_http_handler *)nni_list_first(list);
  nVar1 = NNG_ENOENT;
  do {
    if (item == (nni_http_handler *)0x0) {
LAB_0013aaae:
      nni_mtx_unlock(&s->mtx);
      return nVar1;
    }
    if (item == h) {
      nni_list_remove(list,h);
      nVar1 = NNG_OK;
      goto LAB_0013aaae;
    }
    item = (nni_http_handler *)nni_list_next(list,item);
  } while( true );
}

Assistant:

nng_err
nni_http_server_del_handler(nni_http_server *s, nni_http_handler *h)
{
	nng_err           rv = NNG_ENOENT;
	nni_http_handler *srch;
	nni_mtx_lock(&s->mtx);
	NNI_LIST_FOREACH (&s->handlers, srch) {
		if (srch == h) {
			// NB: We are giving the caller our reference
			// on the handler.
			nni_list_remove(&s->handlers, h);
			rv = NNG_OK;
			break;
		}
	}
	nni_mtx_unlock(&s->mtx);

	return (rv);
}